

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.h
# Opt level: O2

void __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::GetErrorLineInfo
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,int32 *ichMin,int32 *ichLim,int32 *line,
          int32 *ichMinLine)

{
  charcount_t cVar1;
  
  cVar1 = IchMinError(this);
  *ichMin = cVar1;
  cVar1 = IchLimError(this);
  *ichLim = cVar1;
  *line = this->m_line;
  cVar1 = IchMinLine(this);
  *ichMinLine = cVar1;
  if ((this->m_ichLimError != 0) && (this->m_ichMinError < cVar1)) {
    *line = this->m_startLine;
    cVar1 = UpdateLine(this,line,this->m_pchStartLine,this->m_pchLast,0,*ichMin);
    *ichMinLine = cVar1;
  }
  return;
}

Assistant:

virtual void GetErrorLineInfo(__out int32& ichMin, __out int32& ichLim, __out int32& line, __out int32& ichMinLine)
    {
        ichMin = this->IchMinError();
        ichLim = this->IchLimError();
        line   = this->LineCur();
        ichMinLine = this->IchMinLine();
        if (m_ichLimError && m_ichMinError < (charcount_t)ichMinLine)
        {
            line = m_startLine;
            ichMinLine = UpdateLine(line, m_pchStartLine, m_pchLast, 0, ichMin);
        }
    }